

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astnode.cpp
# Opt level: O1

void __thiscall ASTNode::execute(ASTNode *this)

{
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"No execute method","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00139650;
  __cxa_throw(this_00,&ASTException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ASTNode::execute() {
    throw ASTException("No execute method");
}